

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::PrimitiveSymbol::serializeTo(PrimitiveSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  ASTSerializer *in_RSI;
  long in_RDI;
  TableEntry *row;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL> *__range3;
  ASTSerializer *in_stack_ffffffffffffff08;
  ASTSerializer *in_stack_ffffffffffffff10;
  span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>
  *in_stack_ffffffffffffff18;
  ASTSerializer *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  ASTSerializer *this_01;
  ASTSerializer *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  undefined8 local_b0;
  void *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  void *local_88;
  size_t local_80;
  char *local_78;
  undefined8 local_70;
  void *local_68;
  reference local_60;
  TableEntry *local_58;
  __normal_iterator<const_slang::ast::PrimitiveSymbol::TableEntry_*,_std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>_>
  local_50;
  long local_48;
  int local_30;
  void *local_28;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  ASTSerializer::write(in_RSI,local_20,local_18,(ulong)(*(byte *)(in_RDI + 0xa0) & 1));
  if (*(long *)(in_RDI + 0x98) != 0) {
    in_stack_ffffffffffffff28 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    ASTSerializer::write(in_stack_ffffffffffffff28,local_30,local_28,*(size_t *)(in_RDI + 0x98));
  }
  bVar1 = std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL> *)
                     0x728f56);
  if (!bVar1) {
    this_01 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
               (char *)in_stack_ffffffffffffff18);
    name._M_str = (char *)in_RSI;
    name._M_len = (size_t)in_stack_ffffffffffffff28;
    ASTSerializer::startArray(this_01,name);
    local_48 = in_RDI + 0x88;
    local_50._M_current =
         (TableEntry *)
         std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL> *)
                    in_stack_ffffffffffffff08);
    local_58 = (TableEntry *)
               std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>::end
                         (in_stack_ffffffffffffff18);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::PrimitiveSymbol::TableEntry_*,_std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::PrimitiveSymbol::TableEntry_*,_std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffff10,
                         (__normal_iterator<const_slang::ast::PrimitiveSymbol::TableEntry_*,_std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffff08);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_60 = __gnu_cxx::
                 __normal_iterator<const_slang::ast::PrimitiveSymbol::TableEntry_*,_std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>_>
                 ::operator*(&local_50);
      ASTSerializer::startObject((ASTSerializer *)0x729018);
      this_00 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_01,(char *)local_10);
      local_80 = (local_60->inputs)._M_len;
      local_78 = (local_60->inputs)._M_str;
      ASTSerializer::write(this_00,(int)local_70,local_68,local_80);
      if (local_60->state != '\0') {
        in_stack_ffffffffffffff10 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)this_01,(char *)this_00);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a0,&local_60->state,1);
        ASTSerializer::write(in_stack_ffffffffffffff10,(int)local_90,local_88,local_a0._M_len);
      }
      in_stack_ffffffffffffff08 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_01,(char *)this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c0,&local_60->output,1);
      ASTSerializer::write(in_stack_ffffffffffffff08,(int)local_b0,local_a8,local_c0._M_len);
      ASTSerializer::endObject((ASTSerializer *)0x729143);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::PrimitiveSymbol::TableEntry_*,_std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>_>
      ::operator++(&local_50);
    }
    ASTSerializer::endArray((ASTSerializer *)0x729162);
  }
  return;
}

Assistant:

void PrimitiveSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isSequential", isSequential);
    if (initVal)
        serializer.write("initVal", *initVal);

    if (!table.empty()) {
        serializer.startArray("table");
        for (auto& row : table) {
            serializer.startObject();
            serializer.write("inputs", row.inputs);
            if (row.state)
                serializer.write("state", std::string_view(&row.state, 1));
            serializer.write("output", std::string_view(&row.output, 1));
            serializer.endObject();
        }
        serializer.endArray();
    }
}